

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

Vec_Ptr_t *
Aig_ManRegProjectOnehots(Aig_Man_t *pAig,Aig_Man_t *pPart,Vec_Ptr_t *vOnehots,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  Vec_Int_t *pVVar6;
  Aig_Obj_t *pObj_00;
  int local_60;
  int local_5c;
  int k;
  int i;
  int iReg;
  int nOffset;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Vec_Int_t *vGroupNew;
  Vec_Int_t *vGroup;
  Vec_Ptr_t *vOnehotsPart;
  int fVerbose_local;
  Vec_Ptr_t *vOnehots_local;
  Aig_Man_t *pPart_local;
  Aig_Man_t *pAig_local;
  
  vGroup = (Vec_Int_t *)0x0;
  for (local_5c = 0; iVar1 = Vec_PtrSize(pPart->vCis), local_5c < iVar1; local_5c = local_5c + 1) {
    pvVar5 = Vec_PtrEntry(pPart->vCis,local_5c);
    *(int *)((long)pvVar5 + 0x28) = local_5c;
  }
  iVar1 = Aig_ManCiNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  for (local_5c = 0; iVar3 = Vec_PtrSize(vOnehots), local_5c < iVar3; local_5c = local_5c + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vOnehots,local_5c);
    pObj = (Aig_Obj_t *)0x0;
    for (local_60 = 0; iVar3 = Vec_IntSize(pVVar6), local_60 < iVar3; local_60 = local_60 + 1) {
      iVar3 = Vec_IntEntry(pVVar6,local_60);
      pObj_00 = Aig_ManCi(pAig,(iVar1 - iVar2) + iVar3);
      iVar3 = Aig_ObjIsTravIdCurrent(pAig,pObj_00);
      if (iVar3 != 0) {
        if (pObj == (Aig_Obj_t *)0x0) {
          iVar3 = Vec_IntSize(pVVar6);
          pObj = (Aig_Obj_t *)Vec_IntAlloc(iVar3);
        }
        Vec_IntPush((Vec_Int_t *)pObj,*(int *)((long)(pObj_00->field_5).pData + 0x28));
      }
    }
    if (pObj != (Aig_Obj_t *)0x0) {
      iVar3 = Vec_IntSize((Vec_Int_t *)pObj);
      if (iVar3 < 2) {
        Vec_IntFree((Vec_Int_t *)pObj);
      }
      else {
        if (vGroup == (Vec_Int_t *)0x0) {
          vGroup = (Vec_Int_t *)Vec_PtrAlloc(100);
        }
        Vec_PtrPush((Vec_Ptr_t *)vGroup,pObj);
      }
    }
  }
  for (local_5c = 0; iVar1 = Vec_PtrSize(pPart->vCis), local_5c < iVar1; local_5c = local_5c + 1) {
    pvVar5 = Vec_PtrEntry(pPart->vCis,local_5c);
    *(undefined4 *)((long)pvVar5 + 0x28) = 0;
  }
  if ((vGroup != (Vec_Int_t *)0x0) && (fVerbose != 0)) {
    uVar4 = Vec_PtrSize((Vec_Ptr_t *)vGroup);
    printf("Partition contains %d groups of 1-hot registers: { ",(ulong)uVar4);
    for (local_60 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vGroup), local_60 < iVar1;
        local_60 = local_60 + 1) {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vGroup,local_60);
      uVar4 = Vec_IntSize(pVVar6);
      printf("%d ",(ulong)uVar4);
    }
    printf("}\n");
  }
  return (Vec_Ptr_t *)vGroup;
}

Assistant:

Vec_Ptr_t * Aig_ManRegProjectOnehots( Aig_Man_t * pAig, Aig_Man_t * pPart, Vec_Ptr_t * vOnehots, int fVerbose )
{
    Vec_Ptr_t * vOnehotsPart = NULL;
    Vec_Int_t * vGroup, * vGroupNew;
    Aig_Obj_t * pObj, * pObjNew;
    int nOffset, iReg, i, k;
    // set the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = i;
    // go through each group and check if registers are involved in this one
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, i )
    {
        vGroupNew = NULL;
        Vec_IntForEachEntry( vGroup, iReg, k )
        {
            pObj = Aig_ManCi( pAig, nOffset+iReg );
            if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
                continue;
            if ( vGroupNew == NULL )
                vGroupNew = Vec_IntAlloc( Vec_IntSize(vGroup) );
            pObjNew = (Aig_Obj_t *)pObj->pData;
            Vec_IntPush( vGroupNew, pObjNew->iData );
        }
        if ( vGroupNew == NULL )
            continue;
        if ( Vec_IntSize(vGroupNew) > 1 )
        {
            if ( vOnehotsPart == NULL )
                vOnehotsPart = Vec_PtrAlloc( 100 );
            Vec_PtrPush( vOnehotsPart, vGroupNew );
        }
        else
            Vec_IntFree( vGroupNew );
    }
    // clear the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = 0;
    // print out
    if ( vOnehotsPart && fVerbose )
    {
        printf( "Partition contains %d groups of 1-hot registers: { ", Vec_PtrSize(vOnehotsPart) );
        Vec_PtrForEachEntry( Vec_Int_t *, vOnehotsPart, vGroup, k )
            printf( "%d ", Vec_IntSize(vGroup) );
        printf( "}\n" );
    }
    return vOnehotsPart;
}